

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QObject_*,_QString>_>::rehash
          (Data<QHashPrivate::Node<QObject_*,_QString>_> *this,size_t sizeHint)

{
  byte bVar1;
  ulong uVar2;
  Span *pSVar3;
  Entry *pEVar4;
  Data *pDVar5;
  char16_t *pcVar6;
  qsizetype qVar7;
  Entry *pEVar8;
  Node<QObject_*,_QString> *pNVar9;
  ulong uVar10;
  ulong uVar11;
  size_t index;
  long lVar12;
  size_t numBuckets;
  Span *pSVar13;
  long lVar14;
  R_conflict7 RVar15;
  Bucket BVar16;
  
  if (sizeHint == 0) {
    sizeHint = this->size;
  }
  numBuckets = 0x80;
  if ((0x40 < sizeHint) && (numBuckets = 0xffffffffffffffff, sizeHint >> 0x3e == 0)) {
    lVar12 = 0x3f;
    if (sizeHint != 0) {
      for (; sizeHint >> lVar12 == 0; lVar12 = lVar12 + -1) {
      }
    }
    numBuckets = 1L << (0x41 - ((byte)lVar12 ^ 0x3f) & 0x3f);
  }
  uVar2 = this->numBuckets;
  pSVar3 = this->spans;
  RVar15 = allocateSpans(numBuckets);
  this->spans = (Span *)RVar15.spans;
  this->numBuckets = numBuckets;
  if (uVar2 < 0x80) {
    if (pSVar3 == (Span *)0x0) {
      return;
    }
  }
  else {
    uVar10 = 0;
    pSVar13 = pSVar3;
    do {
      lVar12 = 0;
      do {
        bVar1 = pSVar13->offsets[lVar12];
        if (bVar1 != 0xff) {
          pEVar4 = pSVar3[uVar10].entries;
          uVar11 = *(ulong *)pEVar4[bVar1].storage.data;
          uVar11 = (uVar11 >> 0x20 ^ uVar11) * -0x2917014799a6026d;
          uVar11 = (uVar11 >> 0x20 ^ uVar11) * -0x2917014799a6026d;
          BVar16 = Data<QHashPrivate::Node<QObject*,QString>>::findBucketWithHash<QObject*>
                             ((Data<QHashPrivate::Node<QObject*,QString>> *)this,
                              (QObject **)(pEVar4 + bVar1),uVar11 >> 0x20 ^ this->seed ^ uVar11);
          pNVar9 = Span<QHashPrivate::Node<QObject_*,_QString>_>::insert(BVar16.span,BVar16.index);
          pNVar9->key = *(QObject **)pEVar4[bVar1].storage.data;
          pDVar5 = *(Data **)(pEVar4[bVar1].storage.data + 8);
          pEVar8 = pEVar4 + bVar1;
          (pEVar8->storage).data[8] = '\0';
          (pEVar8->storage).data[9] = '\0';
          (pEVar8->storage).data[10] = '\0';
          (pEVar8->storage).data[0xb] = '\0';
          (pEVar8->storage).data[0xc] = '\0';
          (pEVar8->storage).data[0xd] = '\0';
          (pEVar8->storage).data[0xe] = '\0';
          (pEVar8->storage).data[0xf] = '\0';
          (pNVar9->value).d.d = pDVar5;
          pcVar6 = *(char16_t **)(pEVar4[bVar1].storage.data + 0x10);
          pEVar8 = pEVar4 + bVar1;
          (pEVar8->storage).data[0x10] = '\0';
          (pEVar8->storage).data[0x11] = '\0';
          (pEVar8->storage).data[0x12] = '\0';
          (pEVar8->storage).data[0x13] = '\0';
          (pEVar8->storage).data[0x14] = '\0';
          (pEVar8->storage).data[0x15] = '\0';
          (pEVar8->storage).data[0x16] = '\0';
          (pEVar8->storage).data[0x17] = '\0';
          (pNVar9->value).d.ptr = pcVar6;
          qVar7 = *(qsizetype *)(pEVar4[bVar1].storage.data + 0x18);
          pEVar4 = pEVar4 + bVar1;
          (pEVar4->storage).data[0x18] = '\0';
          (pEVar4->storage).data[0x19] = '\0';
          (pEVar4->storage).data[0x1a] = '\0';
          (pEVar4->storage).data[0x1b] = '\0';
          (pEVar4->storage).data[0x1c] = '\0';
          (pEVar4->storage).data[0x1d] = '\0';
          (pEVar4->storage).data[0x1e] = '\0';
          (pEVar4->storage).data[0x1f] = '\0';
          (pNVar9->value).d.size = qVar7;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x80);
      Span<QHashPrivate::Node<QObject_*,_QString>_>::freeData(pSVar3 + uVar10);
      uVar10 = uVar10 + 1;
      pSVar13 = pSVar13 + 1;
    } while (uVar10 != uVar2 >> 7);
  }
  lVar12 = *(long *)&pSVar3[-1].allocated;
  if (lVar12 != 0) {
    lVar14 = lVar12 * 0x90;
    do {
      Span<QHashPrivate::Node<QObject_*,_QString>_>::freeData
                ((Span<QHashPrivate::Node<QObject_*,_QString>_> *)(pSVar3[-1].offsets + lVar14));
      lVar14 = lVar14 + -0x90;
    } while (lVar14 != 0);
  }
  operator_delete__(&pSVar3[-1].allocated,lVar12 * 0x90 + 8);
  return;
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }